

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorInfo.hpp
# Opt level: O3

void __thiscall
helics::TranslatorInfo::TranslatorInfo
          (TranslatorInfo *this,GlobalHandle handle,string_view key_,string_view endpointType,
          string_view units)

{
  string_view ptype;
  string_view type_;
  
  this->id = handle;
  (this->key)._M_dataplus._M_p = (pointer)&(this->key).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->key,key_._M_str,key_._M_str + key_._M_len);
  this->flags = 0;
  (this->tranOp).super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->tranOp).super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ptype._M_str = "any";
  ptype._M_len = 3;
  PublicationInfo::PublicationInfo(&this->pub,handle,key_,ptype,units);
  type_._M_str = "any";
  type_._M_len = 3;
  InputInfo::InputInfo(&this->ipt,handle,key_,type_,units);
  EndpointInfo::EndpointInfo(&this->ept,handle,key_,endpointType);
  return;
}

Assistant:

TranslatorInfo(GlobalHandle handle,
                   std::string_view key_,
                   std::string_view endpointType,
                   std::string_view units):
        id(handle), key(key_), pub(handle, key_, "any", units), ipt(handle, key_, "any", units),
        ept(handle, key_, endpointType)
    {
    }